

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_telnet.c
# Opt level: O3

oonf_telnet_result oonf_telnet_execute(char *cmd,char *para,autobuf *out,netaddr *remote)

{
  list_entity *plVar1;
  _func_void_oonf_telnet_data_ptr *p_Var2;
  oonf_telnet_result oVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  undefined1 auStack_328 [576];
  oonf_telnet_data local_e8;
  
  memset(auStack_328,0,0x2f0);
  local_e8.cleanup_list.next = &local_e8.cleanup_list;
  local_e8.remote = remote;
  local_e8.out = out;
  local_e8.command = cmd;
  local_e8.parameter = para;
  local_e8.cleanup_list.prev = local_e8.cleanup_list.next;
  oVar3 = _telnet_handle_command(&local_e8);
  p_Var2 = local_e8.stop_handler;
  if (local_e8.stop_handler != (_func_void_oonf_telnet_data_ptr *)0x0) {
    local_e8.stop_handler = (_func_void_oonf_telnet_data_ptr *)0x0;
    (*p_Var2)(&local_e8);
  }
  plVar5 = (local_e8.cleanup_list.next)->prev;
  plVar4 = local_e8.cleanup_list.next;
  while (plVar5 != local_e8.cleanup_list.prev) {
    plVar1 = plVar4->next;
    plVar5->next = plVar1;
    plVar1->prev = plVar5;
    plVar4->next = (list_entity *)0x0;
    plVar4->prev = (list_entity *)0x0;
    (*(code *)plVar4[-1].next)((uint64_t *)((long)(plVar4 + -2) + 8));
    plVar4 = plVar1;
    plVar5 = plVar1->prev;
  }
  if ((local_e8.out)->_error != false) {
    oVar3 = TELNET_RESULT_INTERNAL_ERROR;
  }
  return oVar3;
}

Assistant:

enum oonf_telnet_result
oonf_telnet_execute(const char *cmd, const char *para, struct autobuf *out, struct netaddr *remote)
{
  struct oonf_telnet_cleanup *handler, *it;
  struct oonf_telnet_session session;
  enum oonf_telnet_result result;

  memset(&session, 0, sizeof(session));
  session.data.command = cmd;
  session.data.parameter = para;
  session.data.out = out;
  session.data.remote = remote;

  list_init_head(&session.data.cleanup_list);

  result = _telnet_handle_command(&session.data);
  _call_stop_handler(&session.data);

  /* call all cleanup handlers */
  list_for_each_element_safe(&session.data.cleanup_list, handler, node, it) {
    /* remove from list first */
    oonf_telnet_remove_cleanup(handler);

    /* after this command the handler pointer might not be valid anymore */
    handler->cleanup_handler(handler);
  }

  return abuf_has_failed(session.data.out) ? TELNET_RESULT_INTERNAL_ERROR : result;
}